

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],String *params_1,
          char (*params_2) [18],StringPtr *params_3,char (*params_4) [3])

{
  char (*value) [2];
  String *value_00;
  char (*value_01) [18];
  StringPtr *value_02;
  char (*value_03) [3];
  String *params_4_00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  char (*params_local_4) [3];
  StringPtr *params_local_3;
  char (*params_local_2) [18];
  String *params_local_1;
  char (*params_local) [2];
  
  params_4_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = (char (*) [18])params;
  params_local_1 = (String *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_48 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<kj::String&>((String *)params_local_2);
  local_58 = toCharSequence<kj::String&>(value_00);
  value_01 = ::const((char (*) [18])params_local_3);
  local_68 = toCharSequence<char_const(&)[18]>(value_01);
  value_02 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_78 = toCharSequence<kj::StringPtr&>(value_02);
  value_03 = ::const((char (*) [3])local_38);
  local_88 = toCharSequence<char_const(&)[3]>(value_03);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}